

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::absF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_00;
  long lVar1;
  Literal local_90;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_60,this);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)(local_60 + lVar1);
    abs(&local_78,(int)this_00);
    Literal(&local_90,&local_78);
    if (this_00 != &local_90) {
      ~Literal(this_00);
      Literal(this_00,&local_90);
    }
    ~Literal(&local_90);
    ~Literal(&local_78);
  }
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_60);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::abs>(*this);
}